

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandOrder(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  char *pcVar2;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fReverse;
  int c;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"rvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        _fReverse = (char *)0x0;
        if (argc == globalUtilOptind + 1) {
          _fReverse = argv[globalUtilOptind];
          __stream = fopen(_fReverse,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open file \"%s\" with the BDD variable order.\n",_fReverse);
            return 1;
          }
          fclose(__stream);
        }
        if (_fReverse == (char *)0x0) {
          Abc_NtkFindCiOrder(pNtk_00,local_48,local_4c);
        }
        else {
          Abc_NtkImplementCiOrder(pNtk_00,_fReverse,local_48,local_4c);
        }
        pAbc_local._4_4_ = 0;
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x72) {
      local_48 = local_48 ^ 1;
    }
    else {
      if (iVar1 != 0x76) break;
      local_4c = local_4c ^ 1;
    }
  }
  Abc_Print(-2,"usage: order [-rvh] <file>\n");
  Abc_Print(-2,"\t         computes a good static CI variable order\n");
  pcVar2 = "no";
  if (local_48 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-r     : toggle reverse ordering [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_4c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : (optional) file with the given variable order\n");
  return 1;
}

Assistant:

int Abc_CommandOrder( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    char * pFileName;
    int c;
    int fReverse;
    int fVerbose;
    extern void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose );
    extern void Abc_NtkFindCiOrder( Abc_Ntk_t * pNtk, int fReverse, int fVerbose );

    // set defaults
    fReverse = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
//    if ( Abc_NtkLatchNum(pNtk) > 0 )
//    {
//        Abc_Print( -1, "Currently this procedure does not work for sequential networks.\n" );
//        return 1;
//    }

    // if the var order file is given, implement this order
    pFileName = NULL;
    if ( argc == globalUtilOptind + 1 )
    {
        pFileName = argv[globalUtilOptind];
        pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the BDD variable order.\n", pFileName );
            return 1;
        }
        fclose( pFile );
    }
    if ( pFileName )
        Abc_NtkImplementCiOrder( pNtk, pFileName, fReverse, fVerbose );
    else
        Abc_NtkFindCiOrder( pNtk, fReverse, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: order [-rvh] <file>\n" );
    Abc_Print( -2, "\t         computes a good static CI variable order\n" );
    Abc_Print( -2, "\t-r     : toggle reverse ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : (optional) file with the given variable order\n" );
    return 1;
}